

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_root.c
# Opt level: O3

int arkRootfind(void *arkode_mem)

{
  undefined8 uVar1;
  int iVar2;
  undefined8 *puVar3;
  double dVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  bool bVar14;
  int iVar15;
  double dVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  
  if (arkode_mem == (void *)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,0x2fb,"arkRootfind",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_root.c"
                    ,"arkode_mem = NULL illegal.");
    return -0x15;
  }
  puVar3 = *(undefined8 **)((long)arkode_mem + 0x3d8);
  iVar6 = *(int *)(puVar3 + 1);
  lVar7 = (long)iVar6;
  if (lVar7 < 1) {
    puVar3[6] = puVar3[5];
    return 0;
  }
  bVar14 = true;
  bVar5 = false;
  iVar8 = 0;
  lVar11 = 0;
  dVar16 = 0.0;
LAB_0015c57a:
  do {
    lVar10 = lVar11 + 1;
    if (*(int *)(puVar3[0xe] + -4 + lVar10 * 4) != 0) {
      dVar19 = *(double *)(puVar3[8] + -8 + lVar10 * 8);
      if ((dVar19 != 0.0) || (NAN(dVar19))) {
        dVar20 = *(double *)(puVar3[7] + -8 + lVar10 * 8);
        if ((((0.0 < dVar19) && (dVar20 < 0.0)) || ((dVar19 < 0.0 && (0.0 < dVar20)))) &&
           (((double)*(int *)(puVar3[3] + -4 + lVar10 * 4) * dVar20 <= 0.0 &&
            (dVar19 = ABS(dVar19 / (dVar19 - dVar20)), dVar16 < dVar19)))) {
          iVar8 = (int)lVar11;
          bVar14 = false;
          lVar11 = lVar10;
          dVar16 = dVar19;
          if (lVar10 == lVar7) {
            iVar8 = (int)lVar10 + -1;
            goto LAB_0015c733;
          }
          goto LAB_0015c57a;
        }
      }
      else if ((double)*(int *)(puVar3[3] + -4 + lVar10 * 4) *
               *(double *)(puVar3[7] + -8 + lVar10 * 8) <= 0.0) {
        bVar5 = true;
      }
    }
    lVar11 = lVar10;
  } while (lVar10 != lVar7);
  if (bVar14) {
    puVar3[6] = puVar3[5];
    if (iVar6 < 1) {
      return (uint)bVar5;
    }
    lVar11 = puVar3[8];
    lVar10 = puVar3[9];
    lVar12 = 0;
    do {
      *(undefined8 *)(lVar10 + lVar12 * 8) = *(undefined8 *)(lVar11 + lVar12 * 8);
      lVar12 = lVar12 + 1;
    } while (lVar7 != lVar12);
    if (bVar5) {
      if (0 < iVar6) {
        lVar7 = puVar3[2];
        lVar11 = puVar3[0xe];
        lVar10 = 0;
        do {
          *(undefined4 *)(lVar7 + lVar10 * 4) = 0;
          if (((*(int *)(lVar11 + lVar10 * 4) != 0) &&
              (dVar16 = *(double *)(puVar3[8] + lVar10 * 8), dVar16 == 0.0)) && (!NAN(dVar16))) {
            *(uint *)(lVar7 + lVar10 * 4) =
                 (uint)(*(double *)(puVar3[7] + lVar10 * 8) <= 0.0) * 2 + -1;
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 < *(int *)(puVar3 + 1));
        return 1;
      }
      return (uint)bVar5;
    }
    return (uint)bVar5;
  }
LAB_0015c733:
  dVar16 = (double)puVar3[4];
  dVar20 = (double)puVar3[5];
  dVar23 = dVar20 - dVar16;
  dVar4 = ABS(dVar23);
  dVar19 = (double)puVar3[0xb];
  if (dVar19 < dVar4) {
    dVar21 = 0.5;
    dVar22 = 1.0;
    iVar6 = -1;
    iVar15 = 0;
    do {
      if (iVar6 == iVar15) {
        dVar22 = dVar22 * dVar21;
      }
      else {
        dVar22 = 1.0;
      }
      dVar21 = *(double *)(puVar3[8] + (long)iVar8 * 8);
      dVar21 = dVar20 - (dVar23 * dVar21) /
                        (dVar21 - *(double *)(puVar3[7] + (long)iVar8 * 8) * dVar22);
      dVar4 = dVar4 / dVar19;
      if (ABS(dVar21 - dVar16) < dVar19 * 0.5) {
        dVar21 = (double)(-(ulong)(5.0 < dVar4) & 0x3fb999999999999a |
                         ~-(ulong)(5.0 < dVar4) & (ulong)(0.5 / dVar4)) * dVar23 + dVar16;
      }
      dVar16 = dVar21;
      if (ABS(dVar20 - dVar21) < dVar19 * 0.5) {
        dVar16 = (double)(-(ulong)(5.0 < dVar4) & 0xbfb999999999999a |
                         ~-(ulong)(5.0 < dVar4) & (ulong)(-0.5 / dVar4)) * dVar23 + dVar20;
      }
      ARKodeGetDky(arkode_mem,dVar16,0,*(N_Vector *)((long)arkode_mem + 0x248));
      iVar6 = (*(code *)*puVar3)(dVar16,*(undefined8 *)((long)arkode_mem + 0x248),puVar3[9],
                                 puVar3[0x10]);
      puVar3[0xd] = puVar3[0xd] + 1;
      if (iVar6 != 0) {
        return -0xc;
      }
      iVar2 = *(int *)(puVar3 + 1);
      lVar7 = (long)iVar2;
      if (0 < lVar7) {
        bVar14 = true;
        bVar5 = false;
        lVar11 = 0;
        dVar19 = 0.0;
LAB_0015c8f1:
        do {
          lVar10 = lVar11 + 1;
          if (*(int *)(puVar3[0xe] + -4 + lVar10 * 4) != 0) {
            dVar20 = *(double *)(puVar3[9] + -8 + lVar10 * 8);
            if ((dVar20 != 0.0) || (NAN(dVar20))) {
              dVar4 = *(double *)(puVar3[7] + -8 + lVar10 * 8);
              if ((((0.0 < dVar20) && (dVar4 < 0.0)) || ((dVar20 < 0.0 && (0.0 < dVar4)))) &&
                 (((double)*(int *)(puVar3[3] + -4 + lVar10 * 4) * dVar4 <= 0.0 &&
                  (dVar20 = ABS(dVar20 / (dVar20 - dVar4)), dVar19 < dVar20)))) {
                iVar8 = (int)lVar11;
                bVar14 = false;
                lVar11 = lVar10;
                dVar19 = dVar20;
                if (lVar10 == lVar7) {
                  iVar8 = (int)lVar10 + -1;
                  goto LAB_0015ca59;
                }
                goto LAB_0015c8f1;
              }
            }
            else if ((double)*(int *)(puVar3[3] + -4 + lVar10 * 4) *
                     *(double *)(puVar3[7] + -8 + lVar10 * 8) <= 0.0) {
              bVar5 = true;
            }
          }
          lVar11 = lVar10;
        } while (lVar10 != lVar7);
        if (bVar14) {
          if (!bVar5) {
            puVar3[4] = dVar16;
            if (0 < iVar2) {
              lVar11 = puVar3[7];
              lVar10 = puVar3[9];
              lVar12 = 0;
              do {
                *(undefined8 *)(lVar11 + lVar12 * 8) = *(undefined8 *)(lVar10 + lVar12 * 8);
                lVar12 = lVar12 + 1;
              } while (lVar7 != lVar12);
              dVar16 = (double)puVar3[4];
            }
            goto LAB_0015ca18;
          }
          puVar3[5] = dVar16;
          if (iVar2 < 1) {
            puVar3[6] = dVar16;
            return 1;
          }
          lVar11 = puVar3[8];
          lVar10 = puVar3[9];
          lVar12 = 0;
          do {
            *(undefined8 *)(lVar11 + lVar12 * 8) = *(undefined8 *)(lVar10 + lVar12 * 8);
            lVar12 = lVar12 + 1;
          } while (lVar7 != lVar12);
          dVar20 = (double)puVar3[5];
          goto LAB_0015cb27;
        }
LAB_0015ca59:
        puVar3[5] = dVar16;
        dVar20 = dVar16;
        if (0 < iVar2) {
          lVar11 = puVar3[8];
          lVar10 = puVar3[9];
          lVar12 = 0;
          do {
            *(undefined8 *)(lVar11 + lVar12 * 8) = *(undefined8 *)(lVar10 + lVar12 * 8);
            lVar12 = lVar12 + 1;
          } while (lVar7 != lVar12);
          dVar20 = (double)puVar3[5];
        }
        dVar16 = (double)puVar3[4];
        dVar19 = (double)puVar3[0xb];
        dVar23 = dVar20 - dVar16;
        dVar4 = ABS(dVar23);
        if (dVar19 < dVar4) {
          iVar9 = 1;
          dVar21 = 0.5;
          goto LAB_0015cab8;
        }
        break;
      }
      puVar3[4] = dVar16;
LAB_0015ca18:
      dVar20 = (double)puVar3[5];
      dVar19 = (double)puVar3[0xb];
      dVar23 = dVar20 - dVar16;
      dVar4 = ABS(dVar23);
      if (dVar4 <= dVar19) break;
      iVar9 = 2;
      dVar21 = 2.0;
LAB_0015cab8:
      iVar6 = iVar15;
      iVar15 = iVar9;
    } while (dVar19 < dVar4);
    puVar3[6] = dVar20;
    if (iVar2 < 1) {
      return 1;
    }
  }
  else {
LAB_0015cb27:
    puVar3[6] = dVar20;
  }
  lVar7 = puVar3[2];
  lVar11 = puVar3[8];
  lVar10 = puVar3[9];
  lVar12 = puVar3[0xe];
  lVar13 = 0;
  do {
    dVar16 = *(double *)(lVar11 + lVar13 * 8);
    *(double *)(lVar10 + lVar13 * 8) = dVar16;
    *(undefined4 *)(lVar7 + lVar13 * 4) = 0;
    if (*(int *)(lVar12 + lVar13 * 4) != 0) {
      if ((dVar16 != 0.0) || (NAN(dVar16))) {
        uVar1 = *(undefined8 *)(puVar3[7] + lVar13 * 8);
        uVar17 = (undefined4)uVar1;
        uVar18 = (undefined4)((ulong)uVar1 >> 0x20);
      }
      else {
        dVar19 = *(double *)(puVar3[7] + lVar13 * 8);
        uVar17 = SUB84(dVar19,0);
        uVar18 = (undefined4)((ulong)dVar19 >> 0x20);
        if ((double)*(int *)(puVar3[3] + lVar13 * 4) * dVar19 <= 0.0) {
          *(uint *)(lVar7 + lVar13 * 4) = (uint)(dVar19 <= 0.0) * 2 + -1;
        }
      }
      if ((((0.0 < dVar16) &&
           ((double)CONCAT44(uVar18,uVar17) <= 0.0 && (double)CONCAT44(uVar18,uVar17) != 0.0)) ||
          ((dVar16 < 0.0 &&
           (0.0 <= (double)CONCAT44(uVar18,uVar17) && (double)CONCAT44(uVar18,uVar17) != 0.0)))) &&
         ((double)*(int *)(puVar3[3] + lVar13 * 4) * (double)CONCAT44(uVar18,uVar17) <= 0.0)) {
        *(uint *)(lVar7 + lVar13 * 4) =
             (uint)((double)CONCAT44(uVar18,uVar17) < 0.0 || (double)CONCAT44(uVar18,uVar17) == 0.0)
             * 2 + -1;
      }
    }
    lVar13 = lVar13 + 1;
  } while (lVar13 < *(int *)(puVar3 + 1));
  return 1;
}

Assistant:

int arkRootfind(void* arkode_mem)
{
  sunrealtype alpha, tmid, gfrac, maxfrac, fracint, fracsub;
  int i, retval, imax, side, sideprev;
  sunbooleantype zroot, sgnchg;
  ARKodeMem ark_mem;
  ARKodeRootMem rootmem;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;
  rootmem = ark_mem->root_mem;

  imax = 0;

  /* First check for change in sign in ghi or for a zero in ghi. */
  maxfrac = ZERO;
  zroot   = SUNFALSE;
  sgnchg  = SUNFALSE;
  for (i = 0; i < rootmem->nrtfn; i++)
  {
    if (!rootmem->gactive[i]) { continue; }
    if (SUNRabs(rootmem->ghi[i]) == ZERO)
    {
      if (rootmem->rootdir[i] * rootmem->glo[i] <= ZERO) { zroot = SUNTRUE; }
    }
    else
    {
      if ((DIFFERENT_SIGN(rootmem->glo[i], rootmem->ghi[i])) &&
          (rootmem->rootdir[i] * rootmem->glo[i] <= ZERO))
      {
        gfrac = SUNRabs(rootmem->ghi[i] / (rootmem->ghi[i] - rootmem->glo[i]));
        if (gfrac > maxfrac)
        {
          sgnchg  = SUNTRUE;
          maxfrac = gfrac;
          imax    = i;
        }
      }
    }
  }

  /* If no sign change was found, reset trout and grout.  Then return
     ARK_SUCCESS if no zero was found, or set iroots and return RTFOUND.  */
  if (!sgnchg)
  {
    rootmem->trout = rootmem->thi;
    for (i = 0; i < rootmem->nrtfn; i++)
    {
      rootmem->grout[i] = rootmem->ghi[i];
    }
    if (!zroot) { return (ARK_SUCCESS); }
    for (i = 0; i < rootmem->nrtfn; i++)
    {
      rootmem->iroots[i] = 0;
      if (!rootmem->gactive[i]) { continue; }
      if (SUNRabs(rootmem->ghi[i]) == ZERO)
      {
        rootmem->iroots[i] = rootmem->glo[i] > 0 ? -1 : 1;
      }
    }
    return (RTFOUND);
  }

  /* Initialize alpha to avoid compiler warning */
  alpha = ONE;

  /* A sign change was found.  Loop to locate nearest root. */
  side     = 0;
  sideprev = -1;
  for (;;)
  { /* Looping point */

    /* If interval size is already less than tolerance ttol, break. */
    if (SUNRabs(rootmem->thi - rootmem->tlo) <= rootmem->ttol) { break; }

    /* Set weight alpha.
       On the first two passes, set alpha = 1.  Thereafter, reset alpha
       according to the side (low vs high) of the subinterval in which
       the sign change was found in the previous two passes.
       If the sides were opposite, set alpha = 1.
       If the sides were the same, then double alpha (if high side),
       or halve alpha (if low side).
       The next guess tmid is the secant method value if alpha = 1, but
       is closer to tlo if alpha < 1, and closer to thi if alpha > 1.    */
    if (sideprev == side) { alpha = (side == 2) ? alpha * TWO : alpha * HALF; }
    else { alpha = ONE; }

    /* Set next root approximation tmid and get g(tmid).
       If tmid is too close to tlo or thi, adjust it inward,
       by a fractional distance that is between 0.1 and 0.5.  */
    tmid = rootmem->thi - (rootmem->thi - rootmem->tlo) * rootmem->ghi[imax] /
                            (rootmem->ghi[imax] - alpha * rootmem->glo[imax]);
    if (SUNRabs(tmid - rootmem->tlo) < HALF * rootmem->ttol)
    {
      fracint = SUNRabs(rootmem->thi - rootmem->tlo) / rootmem->ttol;
      fracsub = (fracint > FIVE) ? TENTH : HALF / fracint;
      tmid    = rootmem->tlo + fracsub * (rootmem->thi - rootmem->tlo);
    }
    if (SUNRabs(rootmem->thi - tmid) < HALF * rootmem->ttol)
    {
      fracint = SUNRabs(rootmem->thi - rootmem->tlo) / rootmem->ttol;
      fracsub = (fracint > FIVE) ? TENTH : HALF / fracint;
      tmid    = rootmem->thi - fracsub * (rootmem->thi - rootmem->tlo);
    }

    (void)ARKodeGetDky(ark_mem, tmid, 0, ark_mem->ycur);
    retval = rootmem->gfun(tmid, ark_mem->ycur, rootmem->grout,
                           rootmem->root_data);
    rootmem->nge++;
    if (retval != 0) { return (ARK_RTFUNC_FAIL); }

    /* Check to see in which subinterval g changes sign, and reset imax.
       Set side = 1 if sign change is on low side, or 2 if on high side.  */
    maxfrac  = ZERO;
    zroot    = SUNFALSE;
    sgnchg   = SUNFALSE;
    sideprev = side;
    for (i = 0; i < rootmem->nrtfn; i++)
    {
      if (!rootmem->gactive[i]) { continue; }
      if (SUNRabs(rootmem->grout[i]) == ZERO)
      {
        if (rootmem->rootdir[i] * rootmem->glo[i] <= ZERO) { zroot = SUNTRUE; }
      }
      else
      {
        if ((DIFFERENT_SIGN(rootmem->glo[i], rootmem->grout[i])) &&
            (rootmem->rootdir[i] * rootmem->glo[i] <= ZERO))
        {
          gfrac =
            SUNRabs(rootmem->grout[i] / (rootmem->grout[i] - rootmem->glo[i]));
          if (gfrac > maxfrac)
          {
            sgnchg  = SUNTRUE;
            maxfrac = gfrac;
            imax    = i;
          }
        }
      }
    }
    if (sgnchg)
    {
      /* Sign change found in (tlo,tmid); replace thi with tmid. */
      rootmem->thi = tmid;
      for (i = 0; i < rootmem->nrtfn; i++)
      {
        rootmem->ghi[i] = rootmem->grout[i];
      }
      side = 1;
      /* Stop at root thi if converged; otherwise loop. */
      if (SUNRabs(rootmem->thi - rootmem->tlo) <= rootmem->ttol) { break; }
      continue; /* Return to looping point. */
    }

    if (zroot)
    {
      /* No sign change in (tlo,tmid), but g = 0 at tmid; return root tmid. */
      rootmem->thi = tmid;
      for (i = 0; i < rootmem->nrtfn; i++)
      {
        rootmem->ghi[i] = rootmem->grout[i];
      }
      break;
    }

    /* No sign change in (tlo,tmid), and no zero at tmid.
       Sign change must be in (tmid,thi).  Replace tlo with tmid. */
    rootmem->tlo = tmid;
    for (i = 0; i < rootmem->nrtfn; i++)
    {
      rootmem->glo[i] = rootmem->grout[i];
    }
    side = 2;
    /* Stop at root thi if converged; otherwise loop back. */
    if (SUNRabs(rootmem->thi - rootmem->tlo) <= rootmem->ttol) { break; }

  } /* End of root-search loop */

  /* Reset trout and grout, set iroots, and return RTFOUND. */
  rootmem->trout = rootmem->thi;
  for (i = 0; i < rootmem->nrtfn; i++)
  {
    rootmem->grout[i]  = rootmem->ghi[i];
    rootmem->iroots[i] = 0;
    if (!rootmem->gactive[i]) { continue; }
    if ((SUNRabs(rootmem->ghi[i]) == ZERO) &&
        (rootmem->rootdir[i] * rootmem->glo[i] <= ZERO))
    {
      rootmem->iroots[i] = rootmem->glo[i] > 0 ? -1 : 1;
    }
    if ((DIFFERENT_SIGN(rootmem->glo[i], rootmem->ghi[i])) &&
        (rootmem->rootdir[i] * rootmem->glo[i] <= ZERO))
    {
      rootmem->iroots[i] = rootmem->glo[i] > 0 ? -1 : 1;
    }
  }
  return (RTFOUND);
}